

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O3

bool __thiscall
ruckig::TargetCalculator<3UL,_MinimalVector>::is_input_collinear
          (TargetCalculator<3UL,_MinimalVector> *this,InputParameter<3UL,_MinimalVector> *inp,
          Direction limiting_direction,size_t limiting_dof)

{
  Vector<double> *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  size_t sVar7;
  Vector<double> *pVVar8;
  StandardVector<double,_3UL> *pSVar9;
  size_t sVar10;
  Vector<double> *pVVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  sVar7 = this->degrees_of_freedom;
  if (sVar7 == 0) {
    return false;
  }
  sVar10 = 0;
  do {
    (this->pd).data[sVar10] =
         (inp->target_position).data[sVar10] - (inp->current_position).data[sVar10];
    sVar10 = sVar10 + 1;
  } while (sVar7 != sVar10);
  pVVar11 = &this->pd;
  pVVar1 = &inp->current_velocity;
  sVar10 = 0;
  while ((this->inp_per_dof_synchronization)._M_elems[sVar10] != Phase) {
LAB_00114088:
    sVar10 = sVar10 + 1;
    if (sVar7 == sVar10) {
      return false;
    }
  }
  if (((this->inp_per_dof_control_interface)._M_elems[sVar10] != Position) ||
     (dVar13 = (this->pd).data[sVar10], ABS(dVar13) <= 2.220446049250313e-16)) {
    dVar12 = pVVar1->data[sVar10];
    pVVar8 = pVVar1;
    dVar15 = dVar12;
    if ((ABS(dVar12) <= 2.220446049250313e-16) &&
       (((dVar15 = (inp->current_acceleration).data[sVar10], pVVar8 = &inp->current_acceleration,
         ABS(dVar15) <= 2.220446049250313e-16 &&
         (dVar15 = (inp->target_velocity).data[sVar10], pVVar8 = &inp->target_velocity,
         ABS(dVar15) <= 2.220446049250313e-16)) &&
        (dVar15 = (inp->target_acceleration).data[sVar10], pVVar8 = &inp->target_acceleration,
        ABS(dVar15) <= 2.220446049250313e-16)))) goto LAB_00114088;
    pVVar11 = pVVar8;
    dVar13 = (this->pd).data[sVar10];
  }
  else {
    dVar12 = pVVar1->data[sVar10];
    dVar15 = dVar13;
  }
  dVar2 = (inp->current_acceleration).data[sVar10];
  dVar3 = (inp->target_velocity).data[sVar10];
  dVar4 = (inp->target_acceleration).data[sVar10];
  dVar14 = (inp->max_jerk).data[limiting_dof];
  if (limiting_direction == UP) {
    if (ABS(dVar14) != INFINITY) goto LAB_00114130;
    pSVar9 = (StandardVector<double,_3UL> *)&inp->max_acceleration;
  }
  else {
    if (ABS(dVar14) != INFINITY) {
      dVar14 = (double)((ulong)dVar14 ^ (ulong)DAT_00117080);
      goto LAB_00114130;
    }
    pSVar9 = &this->inp_min_acceleration;
  }
  dVar14 = pSVar9->_M_elems[limiting_dof];
LAB_00114130:
  dVar5 = pVVar11->data[limiting_dof];
  sVar10 = 0;
  do {
    if ((this->inp_per_dof_synchronization)._M_elems[sVar10] == Phase) {
      dVar6 = pVVar11->data[sVar10];
      if (((this->inp_per_dof_control_interface)._M_elems[sVar10] == Position) &&
         (2.220446049250313e-16 < ABS((-dVar13 / dVar15) * dVar6 + (this->pd).data[sVar10]))) {
        return false;
      }
      if (2.220446049250313e-16 < ABS((-dVar12 / dVar15) * dVar6 + pVVar1->data[sVar10])) {
        return false;
      }
      if (2.220446049250313e-16 <
          ABS((-dVar2 / dVar15) * dVar6 + (inp->current_acceleration).data[sVar10])) {
        return false;
      }
      if (2.220446049250313e-16 <
          ABS((-dVar3 / dVar15) * dVar6 + (inp->target_velocity).data[sVar10])) {
        return false;
      }
      if (2.220446049250313e-16 <
          ABS((-dVar4 / dVar15) * dVar6 + (inp->target_acceleration).data[sVar10])) {
        return false;
      }
      (this->new_phase_control).data[sVar10] = (dVar6 * dVar14) / dVar5;
    }
    sVar10 = sVar10 + 1;
    if (sVar7 == sVar10) {
      return true;
    }
  } while( true );
}

Assistant:

bool is_input_collinear(const InputParameter<DOFs, CustomVector>& inp, Profile::Direction limiting_direction, size_t limiting_dof) {
        // Check that vectors pd, v0, a0, vf, af are collinear
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            pd[dof] = inp.target_position[dof] - inp.current_position[dof];
        }

        const Vector<double>* scale_vector = nullptr;
        std::optional<size_t> scale_dof; // Need to find a scale DOF because limiting DOF might not be phase synchronized
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            if (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof]) > eps) {
                scale_vector = &pd;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_velocity[dof]) > eps) {
                scale_vector = &inp.current_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_acceleration[dof]) > eps) {
                scale_vector = &inp.current_acceleration;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_velocity[dof]) > eps) {
                scale_vector = &inp.target_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_acceleration[dof]) > eps) {
                scale_vector = &inp.target_acceleration;
                scale_dof = dof;
                break;
            }
        }

        if (!scale_dof) {
            return false; // Zero everywhere is in theory collinear, but that trivial case is better handled elsewhere
        }

        const double scale = scale_vector->operator[](*scale_dof);
        const double pd_scale = pd[*scale_dof] / scale;
        const double v0_scale = inp.current_velocity[*scale_dof] / scale;
        const double vf_scale = inp.target_velocity[*scale_dof] / scale;
        const double a0_scale = inp.current_acceleration[*scale_dof] / scale;
        const double af_scale = inp.target_acceleration[*scale_dof] / scale;

        const double scale_limiting = scale_vector->operator[](limiting_dof);
        double control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_jerk[limiting_dof] : -inp.max_jerk[limiting_dof];
        if (std::isinf(inp.max_jerk[limiting_dof])) {
            control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_acceleration[limiting_dof] : inp_min_acceleration[limiting_dof];
        }

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            const double current_scale = scale_vector->operator[](dof);
            if (
                (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof] - pd_scale * current_scale) > eps)
                || std::abs(inp.current_velocity[dof] - v0_scale * current_scale) > eps
                || std::abs(inp.current_acceleration[dof] - a0_scale * current_scale) > eps
                || std::abs(inp.target_velocity[dof] - vf_scale * current_scale) > eps
                || std::abs(inp.target_acceleration[dof] - af_scale * current_scale) > eps
            ) {
                return false;
            }

            new_phase_control[dof] = control_limiting * current_scale / scale_limiting;
        }

        return true;
    }